

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O2

void __thiscall
FZFile::parse(FZFile *this,vector<char,_std::allocator<char>_> *buf,array<unsigned_int,_44UL> *fzkey
             )

{
  array<unsigned_int,_44UL> *fzkey_00;
  byte bVar1;
  BRDPartMountingSide BVar2;
  pointer __src;
  pointer pBVar3;
  pointer pBVar4;
  pointer pFVar5;
  pointer pbVar6;
  pointer pBVar7;
  pointer pBVar8;
  double dVar9;
  float fVar10;
  undefined8 uVar11;
  string *psVar12;
  size_t sVar13;
  bool bVar14;
  int iVar15;
  undefined4 uVar16;
  char *pcVar17;
  char *pcVar18;
  char *buffer;
  mapped_type *pmVar19;
  size_t sVar20;
  long lVar21;
  iterator iVar22;
  reference pvVar23;
  size_t __n;
  array<unsigned_int,_44UL> *fzkey_01;
  array<unsigned_int,_44UL> *fzkey_02;
  pointer pcVar24;
  FZFile *pFVar25;
  byte *pbVar26;
  string *psVar27;
  uint *puVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *partname;
  pointer __k;
  FZPartDesc *pdesc_1;
  byte *pbVar29;
  pointer pFVar30;
  uint uVar31;
  ulong uVar32;
  byte *pbVar33;
  byte *pbVar34;
  pointer ppcVar35;
  double dVar36;
  double dVar37;
  char *p;
  uint local_2bc;
  char *local_2b8;
  FZFile *local_2b0;
  char *arena;
  allocator<char> local_299;
  key_type local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  BRDPart part;
  float local_160;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  parts_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string *local_100;
  vector<BRDPart,_std::allocator<BRDPart>_> *local_f8;
  size_t descr_size;
  size_t content_size;
  char *descr;
  vector<BRDPin,_std::allocator<BRDPin>_> *local_d8;
  vector<BRDNail,_std::allocator<BRDNail>_> *local_d0;
  pointer local_c8;
  pointer local_c0;
  FZFile *local_b8;
  char *local_b0;
  vector<char_*,_std::allocator<char_*>_> lines_descr;
  vector<char_*,_std::allocator<char_*>_> lines_content;
  string local_70;
  string local_50;
  
  uVar32 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_b0 = setlocale(1,"C");
  bVar14 = check_fz_key<44ul>(this,fzkey);
  fzkey_00 = &this->key;
  if (bVar14) {
    memcpy(fzkey_00,fzkey,0xb0);
  }
  else {
    bVar14 = check_fz_key<44ul>(this,fzkey_00);
    if (!bVar14) {
      (this->super_BRDFileBase).valid = false;
      (*(this->super_BRDFileBase)._vptr_BRDFileBase[3])(&part,this);
      psVar27 = &(this->super_BRDFileBase).error_msg;
      std::__cxx11::string::_M_assign((string *)psVar27);
      std::__cxx11::string::~string((string *)&part);
      fz_key_to_string<44ul>((string *)&part,(FZFile *)fzkey,fzkey_01);
      std::__cxx11::string::append((string *)psVar27);
      std::__cxx11::string::~string((string *)&part);
      return;
    }
  }
  if (uVar32 < 5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
               ,(allocator<char> *)&local_120);
    std::operator+(&local_218,&local_238,":");
    std::__cxx11::to_string(&local_278,0xe5);
    std::operator+(&local_1f8,&local_218,&local_278);
    std::operator+(&local_1d8,&local_1f8,": ");
    std::operator+(&local_258,&local_1d8,
                   "void FZFile::parse(std::vector<char> &, const std::array<uint32_t, 44> &)");
    std::operator+(&local_298,&local_258,": Assertion `");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts_id,
                   &local_298,"buffer_size > 4");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts_id,
                   "\' failed.");
    std::__cxx11::string::operator=((string *)&(this->super_BRDFileBase).error_msg,(string *)&part);
    std::__cxx11::string::~string((string *)&part);
    std::__cxx11::string::~string((string *)&parts_id);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    pcVar24 = (this->super_BRDFileBase).error_msg._M_dataplus._M_p;
  }
  else {
    sVar20 = (uVar32 + 1) * 3;
    local_b8 = (FZFile *)fzkey_00;
    pcVar17 = (char *)calloc(1,sVar20);
    (this->super_BRDFileBase).file_buf = pcVar17;
    local_2b0 = this;
    if (pcVar17 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                 ,(allocator<char> *)&local_120);
      std::operator+(&local_218,&local_238,":");
      pFVar25 = local_2b0;
      std::__cxx11::to_string(&local_278,0xe8);
      std::operator+(&local_1f8,&local_218,&local_278);
      std::operator+(&local_1d8,&local_1f8,": ");
      std::operator+(&local_258,&local_1d8,
                     "void FZFile::parse(std::vector<char> &, const std::array<uint32_t, 44> &)");
      std::operator+(&local_298,&local_258,": Assertion `");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts_id,
                     &local_298,"file_buf != nullptr");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts_id,
                     "\' failed.");
    }
    else {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(pcVar17,__src,__n);
      }
      pcVar17[uVar32] = '\0';
      arena = pcVar17 + uVar32 + 1;
      pcVar17[sVar20 - 1] = '\0';
      if ((pcVar17[4] != 'x') || ((pcVar17[5] != -100 && (pcVar17[5] != -0x26)))) {
        decode(local_2b0,pcVar17,uVar32);
      }
      content_size = 0;
      descr_size = 0;
      pcVar18 = split(pcVar17,uVar32,&content_size,&descr,&descr_size);
      if (pcVar18 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                   ,(allocator<char> *)&local_120);
        std::operator+(&local_218,&local_238,":");
        pFVar25 = local_2b0;
        std::__cxx11::to_string(&local_278,0x115);
        std::operator+(&local_1f8,&local_218,&local_278);
        std::operator+(&local_1d8,&local_1f8,": ");
        std::operator+(&local_258,&local_1d8,
                       "void FZFile::parse(std::vector<char> &, const std::array<uint32_t, 44> &)");
        std::operator+(&local_298,&local_258,": Assertion `");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &parts_id,&local_298,"content != nullptr");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &parts_id,"\' failed.");
      }
      else if (content_size == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                   ,(allocator<char> *)&local_120);
        std::operator+(&local_218,&local_238,":");
        pFVar25 = local_2b0;
        std::__cxx11::to_string(&local_278,0x116);
        std::operator+(&local_1f8,&local_218,&local_278);
        std::operator+(&local_1d8,&local_1f8,": ");
        std::operator+(&local_258,&local_1d8,
                       "void FZFile::parse(std::vector<char> &, const std::array<uint32_t, 44> &)");
        std::operator+(&local_298,&local_258,": Assertion `");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &parts_id,&local_298,"content_size > 0");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &parts_id,"\' failed.");
      }
      else {
        pcVar18 = decompress(pcVar18,content_size,&content_size);
        sVar13 = content_size;
        if (pcVar18 == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                     ,(allocator<char> *)&local_120);
          std::operator+(&local_218,&local_238,":");
          pFVar25 = local_2b0;
          std::__cxx11::to_string(&local_278,0x118);
          std::operator+(&local_1f8,&local_218,&local_278);
          std::operator+(&local_1d8,&local_1f8,": ");
          std::operator+(&local_258,&local_1d8,
                         "void FZFile::parse(std::vector<char> &, const std::array<uint32_t, 44> &)"
                        );
          std::operator+(&local_298,&local_258,": Assertion `");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parts_id,&local_298,"content != nullptr");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parts_id,"\' failed.");
        }
        else if (content_size == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                     ,(allocator<char> *)&local_120);
          std::operator+(&local_218,&local_238,":");
          pFVar25 = local_2b0;
          std::__cxx11::to_string(&local_278,0x119);
          std::operator+(&local_1f8,&local_218,&local_278);
          std::operator+(&local_1d8,&local_1f8,": ");
          std::operator+(&local_258,&local_1d8,
                         "void FZFile::parse(std::vector<char> &, const std::array<uint32_t, 44> &)"
                        );
          std::operator+(&local_298,&local_258,": Assertion `");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parts_id,&local_298,"content_size > 0");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parts_id,"\' failed.");
        }
        else if (pcVar18 == descr) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                     ,(allocator<char> *)&local_120);
          std::operator+(&local_218,&local_238,":");
          pFVar25 = local_2b0;
          std::__cxx11::to_string(&local_278,0x11b);
          std::operator+(&local_1f8,&local_218,&local_278);
          std::operator+(&local_1d8,&local_1f8,": ");
          std::operator+(&local_258,&local_1d8,
                         "void FZFile::parse(std::vector<char> &, const std::array<uint32_t, 44> &)"
                        );
          std::operator+(&local_298,&local_258,": Assertion `");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parts_id,&local_298,"content != descr");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parts_id,"\' failed.");
        }
        else if (descr_size == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                     ,(allocator<char> *)&local_120);
          std::operator+(&local_218,&local_238,":");
          pFVar25 = local_2b0;
          std::__cxx11::to_string(&local_278,0x11c);
          std::operator+(&local_1f8,&local_218,&local_278);
          std::operator+(&local_1d8,&local_1f8,": ");
          std::operator+(&local_258,&local_1d8,
                         "void FZFile::parse(std::vector<char> &, const std::array<uint32_t, 44> &)"
                        );
          std::operator+(&local_298,&local_258,": Assertion `");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parts_id,&local_298,"descr_size > 0");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parts_id,"\' failed.");
        }
        else {
          buffer = decompress(descr,descr_size,&descr_size);
          descr = buffer;
          if (buffer == (char *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_238,
                       "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                       ,(allocator<char> *)&local_120);
            std::operator+(&local_218,&local_238,":");
            pFVar25 = local_2b0;
            std::__cxx11::to_string(&local_278,0x11e);
            std::operator+(&local_1f8,&local_218,&local_278);
            std::operator+(&local_1d8,&local_1f8,": ");
            std::operator+(&local_258,&local_1d8,
                           "void FZFile::parse(std::vector<char> &, const std::array<uint32_t, 44> &)"
                          );
            std::operator+(&local_298,&local_258,": Assertion `");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &parts_id,&local_298,"descr != nullptr");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &part,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&parts_id,"\' failed.");
          }
          else {
            if (descr_size != 0) {
              parts_id._M_h._M_buckets = &parts_id._M_h._M_single_bucket;
              parts_id._M_h._M_bucket_count = 1;
              parts_id._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              parts_id._M_h._M_element_count = 0;
              parts_id._M_h._M_rehash_policy._M_max_load_factor = 1.0;
              parts_id._M_h._M_rehash_policy._M_next_resize = 0;
              parts_id._M_h._M_single_bucket = (__node_base_ptr)0x0;
              lines_content.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              lines_content.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              lines_content.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              stringfile(pcVar18,&lines_content);
              lines_descr.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              lines_descr.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              lines_descr.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              stringfile(buffer,&lines_descr);
              pFVar25 = local_2b0;
              local_2b8 = pcVar17 + (sVar20 - 1);
              part.name = (char *)CONCAT71(part.name._1_7_,0x2c);
              local_298._M_dataplus._M_p._0_1_ = 0x2e;
              std::replace<char*,char>(pcVar18,pcVar18 + sVar13,(char *)&part,(char *)&local_298);
              local_c8 = lines_content.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              local_d0 = &(pFVar25->super_BRDFileBase).nails;
              local_100 = (string *)&(pFVar25->super_BRDFileBase).error_msg;
              local_f8 = &(pFVar25->super_BRDFileBase).parts;
              local_d8 = &(pFVar25->super_BRDFileBase).pins;
              fVar10 = 1.0;
              local_2bc = 0;
              for (ppcVar35 = lines_content.super__Vector_base<char_*,_std::allocator<char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start; ppcVar35 != local_c8;
                  ppcVar35 = ppcVar35 + 1) {
                pcVar17 = *ppcVar35;
                pbVar33 = (byte *)(pcVar17 + 3);
                pbVar34 = (byte *)(pcVar17 + 5);
                pcVar17 = pcVar17 + -1;
                do {
                  pcVar18 = pcVar17;
                  pbVar26 = pbVar34;
                  pbVar29 = pbVar33;
                  bVar1 = pcVar18[1];
                  pcVar17 = pcVar18 + 1;
                  iVar15 = isspace((uint)bVar1);
                  pbVar33 = pbVar29 + 1;
                  pbVar34 = pbVar26 + 1;
                } while (iVar15 != 0);
                pFVar25 = local_2b0;
                if (bVar1 != 0) {
                  p = pcVar17;
                  iVar15 = strcmp(pcVar17,"UNIT:millimeters");
                  pFVar25 = local_2b0;
                  local_160 = 25.4;
                  if (iVar15 != 0) {
                    local_160 = fVar10;
                  }
                  local_c0 = ppcVar35;
                  fVar10 = local_160;
                  if (*pcVar17 == 'S') {
                    pbVar33 = (byte *)(pcVar18 + 3);
                    if (local_2bc == 3) {
                      pbVar33 = (byte *)(pcVar18 + 5);
                      part.name = (char *)0x0;
                      part.mfgcode._M_dataplus._M_p = (pointer)0x0;
                      part.mfgcode._M_string_length = (size_type)anon_var_dwarf_72a25;
                      while ((uVar31 = (uint)*pbVar33, p = (char *)pbVar33, *pbVar33 != 0 &&
                             (iVar15 = isspace(uVar31), iVar15 != 0))) {
                        pbVar33 = pbVar33 + 1;
                        pbVar26 = pbVar26 + 1;
                      }
                      while ((pbVar34 = pbVar26, (char)uVar31 != '\0' && (uVar31 != 0x21))) {
                        pbVar26 = pbVar34 + 1;
                        p = (char *)pbVar34;
                        uVar31 = (uint)*pbVar34;
                      }
                      pbVar34[-1] = 0;
                      p = p + 1;
                      part.mfgcode._M_string_length =
                           (size_type)fix_to_utf8((char *)pbVar33,&arena,local_2b8);
                      pFVar25 = local_2b0;
                      pbVar34 = (byte *)p;
                      pbVar33 = (byte *)p;
                      while( true ) {
                        pbVar33 = pbVar33 + 1;
                        bVar1 = *pbVar34;
                        if ((bVar1 == 0) || (iVar15 = isspace((uint)bVar1), iVar15 == 0)) break;
                        pbVar34 = pbVar34 + 1;
                      }
                      while ((bVar1 != 0 && (bVar1 != 0x21))) {
                        bVar1 = *pbVar33;
                        pbVar33 = pbVar33 + 1;
                      }
                      pbVar33[-1] = 0;
                      p = (char *)pbVar33;
                      fix_to_utf8((char *)pbVar34,&arena,local_2b8);
                      strtol(p,&p,10);
                      pbVar34 = (byte *)p;
                      pbVar33 = (byte *)p;
                      if (*p == '!') {
                        pbVar34 = (byte *)(p + 1);
                        pbVar33 = pbVar34;
                        p = (char *)pbVar34;
                      }
                      while( true ) {
                        pbVar33 = pbVar33 + 1;
                        bVar1 = *pbVar34;
                        pbVar26 = pbVar34;
                        if ((bVar1 == 0) || (iVar15 = isspace((uint)bVar1), iVar15 == 0)) break;
                        pbVar34 = pbVar34 + 1;
                      }
                      while ((bVar1 != 0 && (bVar1 != 0x21))) {
                        bVar1 = *pbVar33;
                        pbVar33 = pbVar33 + 1;
                        pbVar26 = pbVar26 + 1;
                      }
                      pbVar33[-1] = 0;
                      p = (char *)(pbVar26 + 1);
                      fix_to_utf8((char *)pbVar34,&arena,local_2b8);
                      dVar9 = strtod(p,&p);
                      if (*p == '!') {
                        p = p + 1;
                      }
                      part.name = (char *)CONCAT44((int)(dVar9 * (double)local_160),part.name._0_4_)
                      ;
                      dVar9 = strtod(p,&p);
                      if (*p == '!') {
                        p = p + 1;
                      }
                      part.mfgcode._M_dataplus._M_p._0_4_ = (int)(dVar9 * (double)local_160);
                      pbVar34 = (byte *)p;
                      pbVar33 = (byte *)p;
                      while( true ) {
                        pbVar33 = pbVar33 + 1;
                        bVar1 = *pbVar34;
                        pbVar26 = pbVar34;
                        if ((bVar1 == 0) || (iVar15 = isspace((uint)bVar1), iVar15 == 0)) break;
                        pbVar34 = pbVar34 + 1;
                      }
                      while ((bVar1 != 0 && (bVar1 != 0x21))) {
                        bVar1 = *pbVar33;
                        pbVar33 = pbVar33 + 1;
                        pbVar26 = pbVar26 + 1;
                      }
                      pbVar33[-1] = 0;
                      p = (char *)(pbVar26 + 1);
                      pcVar17 = fix_to_utf8((char *)pbVar34,&arena,local_2b8);
                      if ((*pcVar17 != 'T') || (uVar16 = 2, pcVar17[1] != '\0')) {
                        uVar16 = 1;
                      }
                      part.mfgcode._M_dataplus._M_p._4_4_ = uVar16;
                      strtod(p,&p);
                      if (*p == '!') {
                        p = p + 1;
                      }
                      std::vector<BRDNail,_std::allocator<BRDNail>_>::push_back
                                (local_d0,(value_type *)&part);
                      local_2bc = 3;
                      ppcVar35 = local_c0;
                    }
                    else if (local_2bc == 2) {
                      part.mfgcode._M_string_length =
                           part.mfgcode._M_string_length & 0xffffffff00000000;
                      part.name = (char *)0x0;
                      part.mfgcode._M_dataplus._M_p = (pointer)0x0;
                      part.mfgcode.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_72a25;
                      part.mfgcode.field_2._8_8_ = 0x3fe0000000000000;
                      part.mounting_side = Both;
                      part.part_type = SMD;
                      part.end_of_pins = 0;
                      part.p1.x = 0;
                      while ((uVar31 = (uint)*pbVar33, p = (char *)pbVar33, *pbVar33 != 0 &&
                             (iVar15 = isspace(uVar31), iVar15 != 0))) {
                        pbVar33 = pbVar33 + 1;
                        pbVar29 = pbVar29 + 1;
                      }
                      while ((pbVar34 = pbVar29, (char)uVar31 != '\0' && (uVar31 != 0x21))) {
                        pbVar29 = pbVar34 + 1;
                        p = (char *)pbVar34;
                        uVar31 = (uint)*pbVar34;
                      }
                      pbVar34[-1] = 0;
                      p = p + 1;
                      part.mfgcode.field_2._M_allocated_capacity =
                           (size_type)fix_to_utf8((char *)pbVar33,&arena,local_2b8);
                      pbVar34 = (byte *)p;
                      pbVar33 = (byte *)p;
                      while( true ) {
                        pbVar33 = pbVar33 + 1;
                        bVar1 = *pbVar34;
                        if ((bVar1 == 0) || (iVar15 = isspace((uint)bVar1), iVar15 == 0)) break;
                        pbVar34 = pbVar34 + 1;
                      }
                      while ((bVar1 != 0 && (bVar1 != 0x21))) {
                        bVar1 = *pbVar33;
                        pbVar33 = pbVar33 + 1;
                      }
                      pbVar33[-1] = 0;
                      p = (char *)pbVar33;
                      pcVar17 = fix_to_utf8((char *)pbVar34,&arena,local_2b8);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_298,pcVar17,(allocator<char> *)&local_258);
                      pmVar19 = std::__detail::
                                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&parts_id,&local_298);
                      part.mfgcode._M_dataplus._M_p._4_4_ = *pmVar19;
                      std::__cxx11::string::~string((string *)&local_298);
                      pbVar34 = (byte *)p;
                      pbVar33 = (byte *)p;
                      while( true ) {
                        pbVar33 = pbVar33 + 1;
                        bVar1 = *pbVar34;
                        pbVar26 = pbVar34;
                        if ((bVar1 == 0) || (iVar15 = isspace((uint)bVar1), iVar15 == 0)) break;
                        pbVar34 = pbVar34 + 1;
                      }
                      while ((bVar1 != 0 && (bVar1 != 0x21))) {
                        bVar1 = *pbVar33;
                        pbVar26 = pbVar26 + 1;
                        pbVar33 = pbVar33 + 1;
                      }
                      pbVar33[-1] = 0;
                      p = (char *)(pbVar26 + 1);
                      part._40_8_ = fix_to_utf8((char *)pbVar34,&arena,local_2b8);
                      pbVar34 = (byte *)p;
                      pbVar33 = (byte *)p;
                      while( true ) {
                        pbVar33 = pbVar33 + 1;
                        bVar1 = *pbVar34;
                        pbVar26 = pbVar34;
                        if ((bVar1 == 0) || (iVar15 = isspace((uint)bVar1), iVar15 == 0)) break;
                        pbVar34 = pbVar34 + 1;
                      }
                      while ((bVar1 != 0 && (bVar1 != 0x21))) {
                        bVar1 = *pbVar33;
                        pbVar26 = pbVar26 + 1;
                        pbVar33 = pbVar33 + 1;
                      }
                      pbVar33[-1] = 0;
                      p = (char *)(pbVar26 + 1);
                      pcVar17 = fix_to_utf8((char *)pbVar34,&arena,local_2b8);
                      uVar11 = part._40_8_;
                      sVar20 = strlen((char *)part._40_8_);
                      if ((sVar20 < 2) && ((*(char *)uVar11 == '0' || (*(char *)uVar11 == '\0')))) {
                        part.end_of_pins = (uint)pcVar17;
                        part.p1.x = (int)((ulong)pcVar17 >> 0x20);
                      }
                      dVar9 = strtod(p,&p);
                      if (*p == '!') {
                        p = p + 1;
                      }
                      dVar36 = (double)local_160;
                      part.name = (char *)CONCAT44(part.name._4_4_,(int)(dVar9 * dVar36));
                      dVar9 = strtod(p,&p);
                      if (*p == '!') {
                        p = p + 1;
                      }
                      part.name = (char *)CONCAT44((int)(dVar9 * dVar36),part.name._0_4_);
                      lVar21 = strtol(p,&p,10);
                      if (*p == '!') {
                        p = p + 1;
                      }
                      if ((int)lVar21 < 0) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_120,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                                   ,&local_299);
                        std::operator+(&local_278,&local_120,":");
                        std::__cxx11::to_string(&local_70,0x187);
                        std::operator+(&local_238,&local_278,&local_70);
                        std::operator+(&local_218,&local_238,": ");
                        std::operator+(&local_1f8,&local_218,
                                       "auto FZFile::parse(std::vector<char> &, const std::array<uint32_t, 44> &)::(anonymous class)::operator()() const"
                                      );
                        std::operator+(&local_1d8,&local_1f8,": Assertion `");
                        std::operator+(&local_258,&local_1d8,"value >= 0");
                        std::operator+(&local_298,&local_258,"\' failed.");
                        psVar12 = local_100;
                        std::__cxx11::string::operator=(local_100,(string *)&local_298);
                        std::__cxx11::string::~string((string *)&local_298);
                        std::__cxx11::string::~string((string *)&local_258);
                        std::__cxx11::string::~string((string *)&local_1d8);
                        std::__cxx11::string::~string((string *)&local_1f8);
                        std::__cxx11::string::~string((string *)&local_218);
                        std::__cxx11::string::~string((string *)&local_238);
                        std::__cxx11::string::~string((string *)&local_70);
                        std::__cxx11::string::~string((string *)&local_278);
                        std::__cxx11::string::~string((string *)&local_120);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar12);
                      }
                      part.mfgcode._M_dataplus._M_p._0_4_ = (int)lVar21;
                      dVar9 = strtod(p,&p);
                      if (*p == '!') {
                        p = p + 1;
                      }
                      dVar37 = 0.5;
                      if (0.5 <= dVar9 / 100.0) {
                        dVar37 = dVar9 / 100.0;
                      }
                      part.mfgcode.field_2._8_8_ = dVar37 * dVar36;
                      BVar2 = (local_f8->super__Vector_base<BRDPart,_std::allocator<BRDPart>_>).
                              _M_impl.super__Vector_impl_data._M_start
                              [part.mfgcode._M_dataplus._M_p._4_4_ - 1].mounting_side;
                      if (BVar2 < (Top|Bottom)) {
                        part.mfgcode._M_string_length =
                             CONCAT44(part.mfgcode._M_string_length._4_4_,BVar2);
                      }
                      std::vector<BRDPin,_std::allocator<BRDPin>_>::push_back
                                (local_d8,(value_type *)&part);
                      local_2bc = 2;
                      ppcVar35 = local_c0;
                    }
                    else {
                      p = (char *)pbVar33;
                      if (local_2bc == 1) {
                        part.name = (char *)0x0;
                        part.mfgcode._M_dataplus._M_p = (pointer)&part.mfgcode.field_2;
                        part.mfgcode._M_string_length = 0;
                        part.mfgcode.field_2._M_allocated_capacity =
                             part.mfgcode.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        part.p1.y = 0;
                        part.p2.x = 0;
                        part.p2.y = 0;
                        part.mounting_side = Both;
                        part.part_type = SMD;
                        part.end_of_pins = 0;
                        part.p1.x = 0;
                        while ((uVar31 = (uint)*pbVar33, p = (char *)pbVar33, *pbVar33 != 0 &&
                               (iVar15 = isspace(uVar31), iVar15 != 0))) {
                          pbVar33 = pbVar33 + 1;
                          pbVar29 = pbVar29 + 1;
                        }
                        while ((pbVar34 = pbVar29, (char)uVar31 != '\0' && (uVar31 != 0x21))) {
                          pbVar29 = pbVar34 + 1;
                          p = (char *)pbVar34;
                          uVar31 = (uint)*pbVar34;
                        }
                        pbVar34[-1] = 0;
                        p = p + 1;
                        part.name = fix_to_utf8((char *)pbVar33,&arena,local_2b8);
                        pbVar34 = (byte *)p;
                        pbVar33 = (byte *)p;
                        while( true ) {
                          pbVar33 = pbVar33 + 1;
                          bVar1 = *pbVar34;
                          pbVar26 = pbVar34;
                          if ((bVar1 == 0) || (iVar15 = isspace((uint)bVar1), iVar15 == 0)) break;
                          pbVar34 = pbVar34 + 1;
                        }
                        while ((bVar1 != 0 && (bVar1 != 0x21))) {
                          bVar1 = *pbVar33;
                          pbVar26 = pbVar26 + 1;
                          pbVar33 = pbVar33 + 1;
                        }
                        pbVar33[-1] = 0;
                        p = (char *)(pbVar26 + 1);
                        fix_to_utf8((char *)pbVar34,&arena,local_2b8);
                        pbVar34 = (byte *)p;
                        pbVar33 = (byte *)p;
                        while( true ) {
                          pbVar33 = pbVar33 + 1;
                          bVar1 = *pbVar34;
                          pbVar26 = pbVar34;
                          if ((bVar1 == 0) || (iVar15 = isspace((uint)bVar1), iVar15 == 0)) break;
                          pbVar34 = pbVar34 + 1;
                        }
                        while ((bVar1 != 0 && (bVar1 != 0x21))) {
                          bVar1 = *pbVar33;
                          pbVar26 = pbVar26 + 1;
                          pbVar33 = pbVar33 + 1;
                        }
                        pbVar33[-1] = 0;
                        p = (char *)(pbVar26 + 1);
                        fix_to_utf8((char *)pbVar34,&arena,local_2b8);
                        pbVar34 = (byte *)p;
                        pbVar33 = (byte *)p;
                        while( true ) {
                          pbVar33 = pbVar33 + 1;
                          bVar1 = *pbVar34;
                          pbVar26 = pbVar34;
                          if ((bVar1 == 0) || (iVar15 = isspace((uint)bVar1), iVar15 == 0)) break;
                          pbVar34 = pbVar34 + 1;
                        }
                        while ((bVar1 != 0 && (bVar1 != 0x21))) {
                          bVar1 = *pbVar33;
                          pbVar26 = pbVar26 + 1;
                          pbVar33 = pbVar33 + 1;
                        }
                        pbVar33[-1] = 0;
                        p = (char *)(pbVar26 + 1);
                        pcVar17 = fix_to_utf8((char *)pbVar34,&arena,local_2b8);
                        pbVar33 = (byte *)p;
                        while( true ) {
                          pcVar18 = p;
                          pbVar33 = pbVar33 + 1;
                          uVar31 = (uint)(byte)*p;
                          if ((*p == 0) || (iVar15 = isspace(uVar31), iVar15 == 0)) break;
                          p = pcVar18 + 1;
                        }
                        while ((pbVar34 = pbVar33, (char)uVar31 != '\0' && (uVar31 != 0x21))) {
                          pbVar33 = pbVar34 + 1;
                          p = (char *)pbVar34;
                          uVar31 = (uint)*pbVar34;
                        }
                        pbVar34[-1] = 0;
                        fix_to_utf8(pcVar18,&arena,local_2b8);
                        part._40_8_ = part._40_8_ & 0xffffffff;
                        iVar15 = strcmp(pcVar17,"YES");
                        part.mounting_side = (iVar15 == 0) + Bottom;
                        part.end_of_pins = 0;
                        std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back(local_f8,&part);
                        pBVar3 = (pFVar25->super_BRDFileBase).parts.
                                 super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                                 super__Vector_impl_data._M_finish;
                        pBVar4 = (pFVar25->super_BRDFileBase).parts.
                                 super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_298,part.name,(allocator<char> *)&local_258);
                        pmVar19 = std::__detail::
                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                *)&parts_id,&local_298);
                        *pmVar19 = (mapped_type)(((long)pBVar3 - (long)pBVar4) / 0x48);
                        std::__cxx11::string::~string((string *)&local_298);
                        std::__cxx11::string::~string((string *)&part.mfgcode);
                        local_2bc = 1;
                        ppcVar35 = local_c0;
                      }
                    }
                  }
                  else if (*pcVar17 == 'A') {
                    pcVar18 = pcVar18 + 3;
                    iVar15 = strncmp(pcVar18,"REFDES",6);
                    local_2bc = 1;
                    ppcVar35 = local_c0;
                    if (iVar15 != 0) {
                      iVar15 = strncmp(pcVar18,"NET_NAME",8);
                      local_2bc = 2;
                      ppcVar35 = local_c0;
                      if (iVar15 != 0) {
                        iVar15 = strncmp(pcVar18,"TESTVIA",7);
                        local_2bc = 3;
                        ppcVar35 = local_c0;
                        if (iVar15 != 0) {
                          local_2bc = 3;
                          iVar15 = strncmp(pcVar18,"GRAPHIC_DATA_NAME",0x11);
                          local_2bc = 4;
                          ppcVar35 = local_c0;
                          if (iVar15 != 0) {
                            local_2bc = 4;
                            iVar15 = strncmp(pcVar18,"CLASS",5);
                            local_2bc = 5;
                            ppcVar35 = local_c0;
                            if (iVar15 != 0) {
                              local_2bc = 5;
                              iVar15 = strncmp(pcVar18,"LOGOInfo",8);
                              local_2bc = 6;
                              ppcVar35 = local_c0;
                              if (iVar15 != 0) {
                                local_2bc = 6;
                                iVar15 = strncmp(pcVar18,"UnDrawSym",9);
                                local_2bc = -(uint)(iVar15 != 0) | 7;
                                ppcVar35 = local_c0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              for (uVar32 = 2;
                  uVar32 < (ulong)((long)lines_descr.
                                         super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                   (long)lines_descr.
                                         super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                                         .super__Vector_impl_data._M_start >> 3);
                  uVar32 = uVar32 + 1) {
                pbVar34 = (byte *)lines_descr.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar32];
                pbVar33 = pbVar34 + -1;
                pbVar26 = pbVar34 + 2;
                do {
                  pbVar29 = pbVar26;
                  pbVar34 = pbVar34 + 1;
                  bVar1 = pbVar33[1];
                  pbVar33 = pbVar33 + 1;
                  iVar15 = isspace((uint)bVar1);
                  pbVar26 = pbVar29 + 1;
                } while (iVar15 != 0);
                if ((bVar1 != 0) && (bVar1 != 0x73)) {
                  part.mfgcode.field_2._M_allocated_capacity = 0;
                  part.mfgcode.field_2._8_8_ = 0;
                  part.mounting_side = Both;
                  part.part_type = SMD;
                  while( true ) {
                    bVar1 = *pbVar33;
                    uVar31 = (uint)bVar1;
                    if (((bVar1 == 0) || (iVar15 = isspace(uVar31), bVar1 == 9)) || (iVar15 == 0))
                    break;
                    pbVar33 = pbVar33 + 1;
                    pbVar34 = pbVar34 + 1;
                    pbVar29 = pbVar29 + 1;
                  }
                  while (((char)uVar31 != '\0' && (uVar31 != 9))) {
                    bVar1 = *pbVar34;
                    pbVar34 = pbVar34 + 1;
                    pbVar29 = pbVar29 + 1;
                    uVar31 = (uint)bVar1;
                  }
                  pbVar34[-1] = 0;
                  p = (char *)pbVar34;
                  part.name = fix_to_utf8((char *)pbVar33,&arena,local_2b8);
                  while( true ) {
                    bVar1 = *pbVar34;
                    if (((bVar1 == 0) || (iVar15 = isspace((uint)bVar1), bVar1 == 9)) ||
                       (iVar15 == 0)) break;
                    pbVar34 = pbVar34 + 1;
                    pbVar29 = pbVar29 + 1;
                  }
                  for (; (pbVar29[-1] != 0 && (pbVar29[-1] != 9)); pbVar29 = pbVar29 + 1) {
                  }
                  pbVar29[-1] = 0;
                  p = (char *)pbVar29;
                  part.mfgcode._M_dataplus._M_p = fix_to_utf8((char *)pbVar34,&arena,local_2b8);
                  lVar21 = strtol((char *)pbVar29,&p,10);
                  if (*p == '\t') {
                    p = p + 1;
                  }
                  pbVar33 = (byte *)p;
                  if ((int)lVar21 < 0) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_120,
                               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                               ,&local_299);
                    std::operator+(&local_278,&local_120,":");
                    std::__cxx11::to_string(&local_70,0x1c2);
                    std::operator+(&local_238,&local_278,&local_70);
                    std::operator+(&local_218,&local_238,": ");
                    std::operator+(&local_1f8,&local_218,
                                   "auto FZFile::parse(std::vector<char> &, const std::array<uint32_t, 44> &)::(anonymous class)::operator()() const"
                                  );
                    std::operator+(&local_1d8,&local_1f8,": Assertion `");
                    std::operator+(&local_258,&local_1d8,"value >= 0");
                    std::operator+(&local_298,&local_258,"\' failed.");
                    psVar12 = local_100;
                    std::__cxx11::string::operator=(local_100,(string *)&local_298);
                    std::__cxx11::string::~string((string *)&local_298);
                    std::__cxx11::string::~string((string *)&local_258);
                    std::__cxx11::string::~string((string *)&local_1d8);
                    std::__cxx11::string::~string((string *)&local_1f8);
                    std::__cxx11::string::~string((string *)&local_218);
                    std::__cxx11::string::~string((string *)&local_238);
                    std::__cxx11::string::~string((string *)&local_70);
                    std::__cxx11::string::~string((string *)&local_278);
                    std::__cxx11::string::~string((string *)&local_120);
                    SDL_LogError(1,"%s",*(undefined8 *)psVar12);
                  }
                  part.mfgcode._M_string_length =
                       CONCAT44(part.mfgcode._M_string_length._4_4_,(int)lVar21);
                  pcVar17 = (char *)pbVar33 + 2;
                  pbVar34 = pbVar33;
                  while( true ) {
                    pbVar34 = pbVar34 + 1;
                    bVar1 = *pbVar33;
                    uVar31 = (uint)bVar1;
                    if (((bVar1 == 0) || (iVar15 = isspace(uVar31), bVar1 == 9)) || (iVar15 == 0))
                    break;
                    pbVar33 = pbVar33 + 1;
                    pcVar17 = pcVar17 + 1;
                  }
                  while (((char)uVar31 != '\0' && (uVar31 != 9))) {
                    bVar1 = *pbVar34;
                    pbVar34 = pbVar34 + 1;
                    pcVar17 = pcVar17 + 1;
                    uVar31 = (uint)bVar1;
                  }
                  pbVar34[-1] = 0;
                  p = (char *)pbVar34;
                  pcVar18 = fix_to_utf8((char *)pbVar33,&arena,local_2b8);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_50,pcVar18,(allocator<char> *)&local_258);
                  split_string((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_298,&local_50);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&part.mfgcode.field_2,&local_298);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_298);
                  std::__cxx11::string::~string((string *)&local_50);
                  while( true ) {
                    bVar1 = *pbVar34;
                    if (((bVar1 == 0) || (iVar15 = isspace((uint)bVar1), bVar1 == 9)) ||
                       (iVar15 == 0)) break;
                    pbVar34 = pbVar34 + 1;
                    pcVar17 = pcVar17 + 1;
                  }
                  for (; (pcVar17[-1] != '\0' && (pcVar17[-1] != '\t')); pcVar17 = pcVar17 + 1) {
                  }
                  pcVar17[-1] = '\0';
                  p = pcVar17;
                  pcVar17 = fix_to_utf8((char *)pbVar34,&arena,local_2b8);
                  part.end_of_pins = (uint)pcVar17;
                  part.p1.x = (int)((ulong)pcVar17 >> 0x20);
                  std::vector<FZPartDesc,_std::allocator<FZPartDesc>_>::push_back
                            (&pFVar25->partsDesc,(value_type *)&part);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&part.mfgcode.field_2);
                }
              }
              pFVar5 = (local_2b0->partsDesc).
                       super__Vector_base<FZPartDesc,_std::allocator<FZPartDesc>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              for (pFVar30 = (local_2b0->partsDesc).
                             super__Vector_base<FZPartDesc,_std::allocator<FZPartDesc>_>._M_impl.
                             super__Vector_impl_data._M_start; pFVar25 = local_2b0,
                  uVar31 = local_2bc, pFVar30 != pFVar5; pFVar30 = pFVar30 + 1) {
                pbVar6 = (pFVar30->locations).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (__k = (pFVar30->locations).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; __k != pbVar6; __k = __k + 1)
                {
                  iVar22 = std::
                           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           ::find(&parts_id._M_h,__k);
                  if (iVar22.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                      ._M_cur != (__node_type *)0x0) {
                    pvVar23 = std::vector<BRDPart,_std::allocator<BRDPart>_>::at
                                        (local_f8,(long)*(int *)((long)iVar22.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                                  ._M_cur + 0x28) - 1);
                    std::__cxx11::string::assign((char *)&pvVar23->mfgcode);
                  }
                }
              }
              pBVar7 = (local_2b0->super_BRDFileBase).pins.
                       super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              pBVar3 = (local_2b0->super_BRDFileBase).parts.
                       super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pBVar8 = (local_2b0->super_BRDFileBase).pins.
                       super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar28 = &pBVar8->part;
              for (lVar21 = 0; ((long)pBVar7 - (long)pBVar8) / 0x38 != lVar21; lVar21 = lVar21 + 1)
              {
                if (*puVar28 != 0) {
                  pBVar3[*puVar28 - 1].end_of_pins = (uint)lVar21;
                }
                puVar28 = puVar28 + 0xe;
              }
              gen_outline(local_2b0);
              update_counts(pFVar25);
              setlocale(1,local_b0);
              (pFVar25->super_BRDFileBase).valid = uVar31 != 0;
              if (uVar31 == 0) {
                fz_key_to_string<44ul>(&local_298,local_b8,fzkey_02);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &part,"FZ Key:\n",&local_298);
                std::__cxx11::string::append(local_100);
                std::__cxx11::string::~string((string *)&part);
                std::__cxx11::string::~string((string *)&local_298);
              }
              std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
                        (&lines_descr.super__Vector_base<char_*,_std::allocator<char_*>_>);
              std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
                        (&lines_content.super__Vector_base<char_*,_std::allocator<char_*>_>);
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable(&parts_id._M_h);
              return;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_238,
                       "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/FZFile.cpp"
                       ,(allocator<char> *)&local_120);
            std::operator+(&local_218,&local_238,":");
            pFVar25 = local_2b0;
            std::__cxx11::to_string(&local_278,0x11f);
            std::operator+(&local_1f8,&local_218,&local_278);
            std::operator+(&local_1d8,&local_1f8,": ");
            std::operator+(&local_258,&local_1d8,
                           "void FZFile::parse(std::vector<char> &, const std::array<uint32_t, 44> &)"
                          );
            std::operator+(&local_298,&local_258,": Assertion `");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &parts_id,&local_298,"descr_size > 0");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &part,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&parts_id,"\' failed.");
          }
        }
      }
    }
    std::__cxx11::string::operator=
              ((string *)&(pFVar25->super_BRDFileBase).error_msg,(string *)&part);
    std::__cxx11::string::~string((string *)&part);
    std::__cxx11::string::~string((string *)&parts_id);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    pcVar24 = (pFVar25->super_BRDFileBase).error_msg._M_dataplus._M_p;
  }
  SDL_LogError(1,"%s",pcVar24);
  return;
}

Assistant:

void FZFile::parse(std::vector<char> &buf, const std::array<uint32_t, 44> &fzkey) {
	auto buffer_size = buf.size();
	char *saved_locale;
	float multiplier = 1.0f;
	saved_locale     = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	if (check_fz_key(fzkey)) {
		key = fzkey;
	} else if (!check_fz_key(key)) { // Try to fallback to built-in key
		valid = false;
		error_msg = getKeyErrorMsg();
		error_msg += fz_key_to_string(fzkey);
		return;
	}

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	/*
	 * Some non-encrypted, but zip-encoded files are popping up now and then.
	 *
	 * Thanks to piernov for noticing the starting byte sequence
	 *
	 * Attempt to decode using the decode() call and subsequently
	 * split the file to get the content.  If that fails, then try again
	 * without decoding.
	 */

	uint8_t s1 = file_buf[4];
	uint8_t s2 = file_buf[5];
	if (!((s1 == 0x78) && ((s2 == 0x9C) || (s2 == 0xDA)))) {

		/*
		 * Doesn't have the zlib signature, so decode it first.
		 *
		 * 1 in ~2^16 chance of a false hit.
		 */
		FZFile::decode(file_buf, buffer_size); // RC6 decryption
		                                       // fprintf(stderr,"FZFile:Decoded\n");
	}

	size_t content_size = 0;
	size_t descr_size   = 0;
	char *descr;
	char *content = FZFile::split(file_buf, buffer_size, content_size, descr, descr_size); // then split it

	/*
  if (!content) {
	 // Decryption must have failed, so try again now without decrypting the data
	std::copy(buf.begin(), buf.end(), file_buf);
	content = FZFile::split(file_buf, buffer_size, content_size, descr, descr_size); // then split it
  }
  */

	ENSURE_OR_FAIL(content != nullptr, error_msg, return);
	ENSURE_OR_FAIL(content_size > 0, error_msg, return);
	content = FZFile::decompress(content, content_size, content_size); // decompress zlib content data
	ENSURE_OR_FAIL(content != nullptr, error_msg, return);
	ENSURE_OR_FAIL(content_size > 0, error_msg, return);

	ENSURE_OR_FAIL(content != descr, error_msg, return);
	ENSURE_OR_FAIL(descr_size > 0, error_msg, return);
	descr = FZFile::decompress(descr, descr_size, descr_size);
	ENSURE_OR_FAIL(descr != nullptr, error_msg, return);
	ENSURE_OR_FAIL(descr_size > 0, error_msg, return);

	int current_block = 0;
	std::unordered_map<std::string, int> parts_id; // map between part name and part number

	std::vector<char *> lines_content;
	stringfile(content, lines_content);

	std::vector<char *> lines_descr;
	stringfile(descr, lines_descr);

	// For some reason, some boards have COMMAs as decimal separators. Will wonders ever cease ( I realise this is a regional thing
	// )?
	std::replace(content, content + content_size, ',', '.');

	// Parse the content part (parts, pins, nails)

	for (char *line : lines_content) {
		//	fprintf(stdout,"%s\n", line);

		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		/*
		 * If we have a UNIT: line in the data, see if it's requesting millimeters and scale appropriatley.
		 * Default is units are thou (0.001")
		 */
		if (!strcmp(line, "UNIT:millimeters")) {
			multiplier = 25.4f;
		}

		if (line[0] == 'A') { // New block
			line += 2;        // skip "A!"
			if (!strncmp(line, "REFDES", 6)) {
				current_block = 1;
			} else if (!strncmp(line, "NET_NAME", 8)) {
				current_block = 2;
			} else if (!strncmp(line, "TESTVIA", 7)) {
				current_block = 3;
			} else if (!strncmp(line, "GRAPHIC_DATA_NAME", 17)) {
				current_block = 4;
			} else if (!strncmp(line, "CLASS", 5)) {
				current_block = 5;
			} else if (!strncmp(line, "LOGOInfo", 8)) {
				current_block = 6;
			} else if (!strncmp(line, "UnDrawSym", 9)) {
				current_block = 7;
			} else {
				current_block = -1;
			}
			continue;
		} else if (line[0] != 'S') // Unknown line type
			continue;              // jump to next line
		else
			p += 2; // Skip "S!"

		switch (current_block) {
			case 1: { // Parts
				BRDPart part;
				part.name = READ_STR();
				/*char *cic =*/READ_STR();
				/*char *sname =*/READ_STR();
				char *smirror = READ_STR();
				/*char *srotate =*/READ_STR();
				part.part_type = BRDPartType::SMD;
				if (!strcmp(smirror, "YES"))
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
				part.end_of_pins       = 0;
				parts.push_back(part);
				parts_id[part.name] = parts.size();
			} break;
			case 2: { // Pins
				/* There are more then single FZ file variant even if all those files ahre same header looking like
				A!NET_NAME!REFDES!PIN_NUMBER!PIN_NAME!PIN_X!PIN_Y!TEST_POINT!RADIUS!

				There are at least 2 variants, placing BGA pin label in different places:
				S!SATA_GP1!SU1!AJ43!GPP_E1/SATAXPCIE1/SATAGP1!3315.86!1830.70!!6!
				S!SNN_FBA_WCKB45*!G1!0!AJ31!3140.51!1436.167!!7.48106!

				For first variant the PIN_NAME column is ignored until thre would be a filed for handling/displaying such info
				But for second varinat the PIN_NUMBER column is always the "0" literal, so PIN_NAME is used as name.
				*/
				BRDPin pin;
				pin.net    = READ_STR();
				char *part = READ_STR();
				pin.part   = parts_id.at(part);
				pin.snum   = READ_STR();
				char *name = READ_STR();

				// use name field as pin name if snum is empty string or "0" (decimal zero as string)
				bool name_is_pin_position_id = strlen(pin.snum) <= 1 && (pin.snum[0] == '\0' or pin.snum[0] == '0');
				if (name_is_pin_position_id)
				{
					pin.name = name;
				}
				double posx   = READ_DOUBLE();
				pin.pos.x     = posx * multiplier;
				double posy   = READ_DOUBLE();
				pin.pos.y     = posy * multiplier;
				pin.probe     = READ_UINT();
				double radius = READ_DOUBLE();
				radius /= 100;
				if (radius < 0.5f) radius = 0.5f;
				pin.radius                = radius * multiplier;
				switch (parts[pin.part - 1].mounting_side) {
					case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
					case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
					case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
				}
				pins.push_back(pin);
			} break;
			case 3: {   // Nails
				p += 2; // Skip "Y!"
				BRDNail nail;
				nail.net = READ_STR();
				/*char *refdes =*/READ_STR();
				/*int pinnumber =*/READ_INT(); // uint
				/*char *pinname =*/READ_STR();

				double posx = READ_DOUBLE();
				nail.pos.x  = posx * multiplier;
				double posy = READ_DOUBLE();
				nail.pos.y  = posy * multiplier;
				char *loc   = READ_STR();
				if (!strcmp(loc, "T"))
					nail.side = BRDPartMountingSide::Top;
				else
					nail.side = BRDPartMountingSide::Bottom;
				/*double radius =*/READ_DOUBLE();
				nails.push_back(nail);
			} break;
			case 4: { // Drawing
			} break;
			case 5: { // Unknown
			} break;
			case 6: { // Logo/Info
			} break;
			case 7: { // Unknown
			} break;
		}
	}

	// Parse the descr part (parts info)
	// Note: Discard first 2 lines (board description, currently unused and table columns name)
	for (size_t i = 2; i < lines_descr.size(); ++i) {
		char *line = lines_descr[i];

		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		if (line[0] == 's') continue; // PARTNUMBER starting with 's' seems unused

		FZPartDesc pdesc;
		pdesc.partno      = READ_DESCR_STR();
		pdesc.description = READ_DESCR_STR();
		pdesc.quantity    = READ_DESCR_UINT();
		pdesc.locations   = split_string(READ_DESCR_STR());
		pdesc.partno2     = READ_DESCR_STR();
		partsDesc.push_back(pdesc);
	}

	for (auto &pdesc : partsDesc) {
		for (auto &partname : pdesc.locations) {
			auto iter = parts_id.find(partname);
			if (iter != parts_id.end()) { // Sometimes the desc part references stuff not in content part, ignore it
				parts.at(iter->second - 1).mfgcode = pdesc.description;
			}
		}
	}

	//	std::sort(pins.begin(), pins.end()); // sort vector by part num then pin num
	for (std::vector<int>::size_type i = 0; i < pins.size(); i++) {
		// update end_of_pins field
		if (pins[i].part > 0) parts[pins[i].part - 1].end_of_pins = i;
	}

	gen_outline();

	update_counts();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = current_block != 0;

	if (!valid) {
		error_msg += "FZ Key:\n" + fz_key_to_string(key);
	}
}